

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

SPIRExpression * __thiscall
spirv_cross::CompilerGLSL::emit_uninitialized_temporary_expression
          (CompilerGLSL *this,uint32_t type,uint32_t id)

{
  uint32_t id_00;
  SPIRExpression *pSVar1;
  bool local_49;
  uint32_t id_local;
  uint32_t type_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  id_local = id;
  type_local = type;
  ::std::__detail::
  _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            *)&(this->super_Compiler).forced_temporaries,&id_local);
  emit_uninitialized_temporary(this,type,id_local);
  id_00 = id_local;
  (*(this->super_Compiler)._vptr_Compiler[6])(&local_40,this,(ulong)id_local,1);
  local_49 = true;
  pSVar1 = Compiler::set<spirv_cross::SPIRExpression,std::__cxx11::string,unsigned_int&,bool>
                     (&this->super_Compiler,id_00,&local_40,&type_local,&local_49);
  ::std::__cxx11::string::~string((string *)&local_40);
  return pSVar1;
}

Assistant:

SPIRExpression &CompilerGLSL::emit_uninitialized_temporary_expression(uint32_t type, uint32_t id)
{
	forced_temporaries.insert(id);
	emit_uninitialized_temporary(type, id);
	return set<SPIRExpression>(id, to_name(id), type, true);
}